

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  u8 uVar1;
  byte bVar2;
  uint uVar3;
  Pgno pgno;
  Bitvec *p;
  bool bVar4;
  bool bVar5;
  MemPage *pMVar6;
  MemPage *pMVar7;
  MemPage **ppPage_00;
  int iVar8;
  uint uVar9;
  byte *pbVar10;
  u8 *puVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  undefined7 in_register_00000081;
  bool bVar18;
  int unaff_R13D;
  MemPage *pMVar19;
  MemPage *pTrunk;
  u8 eType;
  int local_a4;
  MemPage *local_88;
  undefined4 local_7c;
  MemPage *local_78;
  Pgno *local_70;
  uint local_68;
  uint local_64;
  ulong local_60;
  MemPage *local_58;
  MemPage **local_50;
  ulong local_48;
  Pgno local_3c;
  ulong local_38;
  
  local_88 = (MemPage *)0x0;
  pMVar19 = pBt->pPage1;
  uVar12 = pBt->nPage;
  uVar16 = *(uint *)(pMVar19->aData + 0x24);
  uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
  uVar14 = (ulong)uVar16;
  local_70 = pPgno;
  if (uVar12 <= uVar16) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfedc,
                "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
    return 0xb;
  }
  if (uVar16 == 0) {
    uVar1 = pBt->bDoTruncate;
    iVar8 = sqlite3PagerWrite(pMVar19->pDbPage);
    if (iVar8 == 0) {
      uVar12 = pBt->nPage;
      pBt->nPage = uVar12 + 1;
      uVar16 = (uint)sqlite3PendingByte / pBt->pageSize;
      if (uVar12 == uVar16) {
        pBt->nPage = uVar12 + 2;
      }
      uVar12 = (uint)(uVar1 == '\0');
      if (pBt->autoVacuum == '\0') {
LAB_00208ec2:
        uVar16 = pBt->nPage;
        *(uint *)(pBt->pPage1->aData + 0x1c) =
             uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
        pgno = pBt->nPage;
        *local_70 = pgno;
        iVar8 = btreeGetUnusedPage(pBt,pgno,ppPage,uVar12);
        if (iVar8 != 0) goto LAB_00208ef2;
        iVar8 = sqlite3PagerWrite((*ppPage)->pDbPage);
        bVar18 = true;
        if (iVar8 != 0) {
          if (*ppPage != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
          }
          *ppPage = (MemPage *)0x0;
        }
      }
      else {
        uVar15 = pBt->nPage;
        uVar9 = 0;
        if (1 < uVar15) {
          iVar8 = (uVar15 - 2) - (uVar15 - 2) % (pBt->usableSize / 5 + 1);
          uVar9 = iVar8 + (uint)(iVar8 + 1U == uVar16) + 2;
        }
        if (uVar9 != uVar15) goto LAB_00208ec2;
        local_58 = (MemPage *)0x0;
        iVar8 = btreeGetUnusedPage(pBt,uVar15,&local_58,uVar12);
        pMVar19 = local_58;
        if ((iVar8 == 0) &&
           (iVar8 = sqlite3PagerWrite(local_58->pDbPage), pMVar19 != (MemPage *)0x0)) {
          sqlite3PagerUnrefNotNull(pMVar19->pDbPage);
        }
        unaff_R13D = iVar8;
        if (iVar8 == 0) {
          uVar16 = pBt->nPage;
          pBt->nPage = uVar16 + 1;
          if (uVar16 == (uint)sqlite3PendingByte / pBt->pageSize) {
            pBt->nPage = uVar16 + 2;
          }
          goto LAB_00208ec2;
        }
        bVar18 = false;
      }
    }
    else {
LAB_00208ef2:
      bVar18 = false;
      unaff_R13D = iVar8;
    }
    if (!bVar18) {
      return unaff_R13D;
    }
    pMVar19 = (MemPage *)0x0;
    goto LAB_00208f97;
  }
  local_3c = nearby;
  local_38 = uVar14;
  if (eMode == '\x02') {
    bVar18 = true;
LAB_00208846:
    iVar8 = sqlite3PagerWrite(pMVar19->pDbPage);
    if (iVar8 != 0) goto LAB_0020885e;
    uVar16 = (int)local_38 - 1;
    *(uint *)(pMVar19->aData + 0x24) =
         uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 * 0x1000000;
    local_48 = 0;
    local_7c = (int)CONCAT71(in_register_00000081,eMode);
    local_78 = pMVar19;
    local_50 = ppPage;
    do {
      pMVar19 = local_88;
      if (local_88 == (MemPage *)0x0) {
        puVar11 = local_78->aData;
        uVar16 = (uint)puVar11[0x22] << 8 |
                 (uint)puVar11[0x21] << 0x10 | (uint)puVar11[0x20] << 0x18;
        pbVar10 = puVar11 + 0x23;
      }
      else {
        pbVar10 = local_88->aData;
        uVar16 = (uint)pbVar10[2] << 8 | (uint)pbVar10[1] << 0x10 | (uint)*pbVar10 << 0x18;
        pbVar10 = pbVar10 + 3;
      }
      uVar16 = *pbVar10 | uVar16;
      if (uVar12 < uVar16) {
LAB_00208902:
        iVar8 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xff14,
                    "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
      }
      else {
        uVar15 = (uint)local_48 + 1;
        if ((uint)local_38 < (uint)local_48) {
          local_48 = (ulong)uVar15;
          goto LAB_00208902;
        }
        iVar8 = btreeGetUnusedPage(pBt,uVar16,&local_88,0);
        local_48 = (ulong)uVar15;
      }
      pMVar6 = local_88;
      if (iVar8 != 0) {
        local_88 = (MemPage *)0x0;
        goto LAB_00208eb8;
      }
      puVar11 = local_88->aData;
      uVar15 = *(uint *)(puVar11 + 4);
      uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
      if ((bVar18) || (uVar15 != 0)) {
        if ((pBt->usableSize >> 2) - 2 < uVar15) {
          iVar8 = 0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xff31,
                      "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
          goto LAB_00208f8c;
        }
        if (bVar18) {
          if ((uVar16 != local_3c) && ((char)local_7c != '\x02' || local_3c <= uVar16))
          goto LAB_002089ea;
          *local_70 = uVar16;
          *local_50 = local_88;
          iVar8 = sqlite3PagerWrite(local_88->pDbPage);
          bVar18 = false;
          if (iVar8 != 0) goto LAB_00208f8c;
          if (uVar15 == 0) {
            if (pMVar19 == (MemPage *)0x0) {
              puVar11 = local_78->aData + 0x20;
            }
            else {
              iVar8 = sqlite3PagerWrite(pMVar19->pDbPage);
              if (iVar8 != 0) goto LAB_00208f91;
              puVar11 = pMVar19->aData;
            }
            *(undefined4 *)puVar11 = *(undefined4 *)pMVar6->aData;
            iVar8 = 0;
          }
          else {
            puVar11 = pMVar6->aData;
            bVar2 = puVar11[0xb];
            uVar16 = (uint)puVar11[10] << 8 | (uint)puVar11[9] << 0x10 | (uint)puVar11[8] << 0x18 |
                     (uint)bVar2;
            if (uVar12 < uVar16) {
              iVar8 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xff53,
                          "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
LAB_00208bad:
              bVar5 = false;
            }
            else {
              local_60 = CONCAT44(local_60._4_4_,(uint)puVar11[8]);
              local_68 = (uint)puVar11[10];
              local_64 = (uint)puVar11[9];
              iVar8 = btreeGetUnusedPage(pBt,uVar16,&local_58,0);
              pMVar7 = local_58;
              if (iVar8 != 0) goto LAB_00208bad;
              iVar8 = sqlite3PagerWrite(local_58->pDbPage);
              if (iVar8 != 0) {
                if (pMVar7 != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull(pMVar7->pDbPage);
                }
                goto LAB_00208bad;
              }
              *(undefined4 *)pMVar7->aData = *(undefined4 *)pMVar6->aData;
              uVar16 = uVar15 - 1;
              *(uint *)(pMVar7->aData + 4) =
                   uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                   uVar16 * 0x1000000;
              memcpy(pMVar7->aData + 8,pMVar6->aData + 0xc,(ulong)(uVar15 * 4 - 4));
              if (pMVar7 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pMVar7->pDbPage);
              }
              if (pMVar19 == (MemPage *)0x0) {
                puVar11 = local_78->aData;
                puVar11[0x20] = (u8)local_60;
                puVar11[0x21] = (u8)local_64;
                puVar11[0x22] = (u8)local_68;
                puVar11[0x23] = bVar2;
                bVar5 = true;
                iVar8 = 0;
              }
              else {
                iVar13 = sqlite3PagerWrite(pMVar19->pDbPage);
                iVar8 = 0;
                if (iVar13 == 0) {
                  puVar11 = pMVar19->aData;
                  *puVar11 = (u8)local_60;
                  puVar11[1] = (u8)local_64;
                  puVar11[2] = (u8)local_68;
                  puVar11[3] = bVar2;
                  bVar5 = true;
                }
                else {
                  bVar5 = false;
                  iVar8 = iVar13;
                }
              }
            }
            bVar18 = false;
            if (!bVar5) goto LAB_00208f91;
          }
          local_88 = (MemPage *)0x0;
          bVar4 = false;
        }
        else {
LAB_002089ea:
          if (uVar15 == 0) goto LAB_00208a39;
          uVar16 = 0;
          if (local_3c != 0) {
            if ((char)local_7c == '\x02') {
              uVar9 = 8;
              uVar14 = 0;
              do {
                uVar3 = *(uint *)(puVar11 + uVar9);
                if ((uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18
                    ) <= local_3c) {
                  uVar16 = (uint)uVar14;
                  break;
                }
                uVar14 = uVar14 + 1;
                uVar9 = uVar9 + 4;
              } while (uVar15 != uVar14);
            }
            else {
              uVar16 = 0;
              if (uVar15 != 1) {
                uVar16 = *(uint *)(puVar11 + 8);
                iVar13 = (uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                         uVar16 << 0x18) - local_3c;
                iVar8 = -iVar13;
                if (-1 < iVar13) {
                  iVar8 = iVar13;
                }
                uVar16 = 0;
                uVar14 = 1;
                uVar9 = 0xc;
                do {
                  uVar3 = *(uint *)(puVar11 + uVar9);
                  iVar17 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                           uVar3 << 0x18) - local_3c;
                  iVar13 = -iVar17;
                  if (-1 < iVar17) {
                    iVar13 = iVar17;
                  }
                  if (iVar13 < iVar8) {
                    uVar16 = (uint)uVar14;
                    iVar8 = iVar13;
                  }
                  uVar14 = uVar14 + 1;
                  uVar9 = uVar9 + 4;
                } while (uVar15 != uVar14);
              }
            }
          }
          uVar14 = (ulong)(uVar16 * 4 + 8);
          uVar9 = *(uint *)(puVar11 + uVar14);
          uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
          if (uVar12 < uVar9) {
            iVar8 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xff94,
                        "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
LAB_00208c59:
            bVar5 = false;
          }
          else {
            if (((uVar9 == local_3c) || ((char)local_7c == '\x02' && uVar9 < local_3c)) || (!bVar18)
               ) {
              *local_70 = uVar9;
              local_60 = uVar14;
              iVar8 = sqlite3PagerWrite(local_88->pDbPage);
              ppPage_00 = local_50;
              if (iVar8 != 0) goto LAB_00208c59;
              uVar9 = uVar15 - 1;
              if (uVar16 < uVar9) {
                *(undefined4 *)(puVar11 + local_60) = *(undefined4 *)(puVar11 + (uVar15 * 4 + 4));
              }
              *(uint *)(puVar11 + 4) =
                   uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                   uVar9 * 0x1000000;
              uVar16 = *local_70;
              p = pBt->pHasContent;
              if (p == (Bitvec *)0x0) {
                uVar15 = 1;
              }
              else {
                uVar15 = 0;
                if (uVar16 <= p->iSize) {
                  iVar8 = sqlite3BitvecTestNotNull(p,uVar16);
                  uVar15 = (uint)(iVar8 == 0);
                }
              }
              iVar8 = btreeGetUnusedPage(pBt,uVar16,ppPage_00,uVar15);
              if (iVar8 == 0) {
                iVar8 = sqlite3PagerWrite((*ppPage_00)->pDbPage);
                if (iVar8 == 0) {
                  bVar18 = false;
                  iVar8 = 0;
                }
                else {
                  if (*ppPage_00 != (MemPage *)0x0) {
                    sqlite3PagerUnrefNotNull((*ppPage_00)->pDbPage);
                  }
                  *ppPage_00 = (MemPage *)0x0;
                  bVar18 = false;
                }
              }
              else {
                bVar18 = false;
              }
            }
            else {
              bVar18 = true;
              iVar8 = 0;
            }
            bVar5 = true;
          }
          bVar4 = bVar18;
          if (!bVar5) goto LAB_00208eb8;
        }
      }
      else {
        iVar8 = sqlite3PagerWrite(local_88->pDbPage);
        if (iVar8 != 0) {
LAB_00208f8c:
          bVar18 = false;
          goto LAB_00208f91;
        }
        *local_70 = uVar16;
        *(undefined4 *)(local_78->aData + 0x20) = *(undefined4 *)pMVar6->aData;
        *local_50 = pMVar6;
        local_88 = (MemPage *)0x0;
        bVar18 = false;
LAB_00208a39:
        iVar8 = 0;
        bVar4 = bVar18;
      }
      if (pMVar19 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(pMVar19->pDbPage);
      }
      bVar18 = true;
    } while (bVar4);
    pMVar19 = (MemPage *)0x0;
LAB_00208eb8:
    bVar18 = false;
  }
  else {
    if ((eMode != '\x01') || (uVar12 < nearby)) {
      bVar18 = false;
      goto LAB_00208846;
    }
    local_78 = pMVar19;
    iVar8 = ptrmapGet(pBt,nearby,(u8 *)&local_58,(Pgno *)0x0);
    if (iVar8 == 0) {
      bVar18 = iVar8 == 0 && (char)local_58 == '\x02';
      pMVar19 = local_78;
      local_a4 = iVar8;
      goto LAB_00208846;
    }
LAB_0020885e:
    pMVar19 = (MemPage *)0x0;
    bVar18 = true;
    local_a4 = iVar8;
  }
LAB_00208f91:
  if (bVar18) {
    return local_a4;
  }
LAB_00208f97:
  if (local_88 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(local_88->pDbPage);
  }
  if (pMVar19 != (MemPage *)0x0) {
    sqlite3PagerUnrefNotNull(pMVar19->pDbPage);
  }
  return iVar8;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-05119-02637 The 4-byte big-endian integer at offset 36
  ** stores stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    u32 nSearch = 0;   /* Count of the number of search attempts */
    
    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage || nSearch++ > n ){
        rc = SQLITE_CORRUPT_PGNO(pPrevTrunk ? pPrevTrunk->pgno : 1);
      }else{
        rc = btreeGetUnusedPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched. 
        ** So extract the trunk page itself and use it as the newly 
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_PGNO(iTrunk);
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList 
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE)) 
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains 
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){ 
            rc = SQLITE_CORRUPT_PGNO(iTrunk);
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetUnusedPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage ){
          rc = SQLITE_CORRUPT_PGNO(iTrunk);
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList 
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE)) 
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %d was leaf %d of %d on trunk %d"
                 ": %d more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
              *ppPage = 0;
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal 
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %d from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetUnusedPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
      *ppPage = 0;
    }
    TRACE(("ALLOCATE: %d from end of file\n", *pPgno));
  }

  assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  assert( rc!=SQLITE_OK || sqlite3PagerPageRefcount((*ppPage)->pDbPage)<=1 );
  assert( rc!=SQLITE_OK || (*ppPage)->isInit==0 );
  return rc;
}